

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict *pmVar5;
  _Rb_tree_header *p_Var6;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  long local_78;
  TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *local_70;
  pointer_____offset_0x60___ *local_68;
  TPZGeoElSide local_60;
  undefined **local_48;
  TPZGeoEl *local_40;
  int local_38;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018bb198;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018b6ab8,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap
                    );
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018b67b8;
  local_68 = &PTR_PTR_018b6ab8;
  local_70 = this;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend(&this->fGeo,&cp->fGeo,gl2lcNdMap);
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_018a3510;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[0].fGeoElIndex = -1;
  TPZGeoElSide::TPZGeoElSide(&local_60,cp->fNeighbours,(cp->super_TPZGeoEl).fMesh);
  local_78 = (local_60.fGeoEl)->fIndex;
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  while( true ) {
    iVar3 = local_60.fSide;
    p_Var2 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
        p_Var2 = (&p_Var2->_M_left)[(long)*(size_t *)(p_Var2 + 1) < local_78]) {
      if (local_78 <= (long)*(size_t *)(p_Var2 + 1)) {
        p_Var4 = p_Var2;
      }
    }
    p_Var6 = p_Var1;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var6 = (_Rb_tree_header *)p_Var4,
       local_78 < (long)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
      p_Var6 = p_Var1;
    }
    if (p_Var6 != p_Var1) break;
    if (local_60.fGeoEl == (TPZGeoEl *)0x0) {
      local_48 = &PTR__TPZGeoElSide_01920090;
      local_40 = (TPZGeoEl *)0x0;
      local_38 = -1;
    }
    else {
      (**(code **)(*(long *)local_60.fGeoEl + 0x188))(&local_48,local_60.fGeoEl,local_60.fSide);
    }
    local_60.fSide = local_38;
    local_60.fGeoEl = local_40;
    local_78 = local_40->fIndex;
  }
  pmVar5 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           operator[](gl2lcElMap,&local_78);
  local_70->fNeighbours[0].fGeoElIndex = *pmVar5;
  local_70->fNeighbours[0].fSide = iVar3;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}